

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O3

ParameterDeclarationBaseSyntax * __thiscall
slang::syntax::SeparatedSyntaxList<slang::syntax::ParameterDeclarationBaseSyntax>::operator[]
          (SeparatedSyntaxList<slang::syntax::ParameterDeclarationBaseSyntax> *this,size_t index)

{
  SyntaxKind SVar1;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar2;
  
  if ((this->elements).size_ <= index * 2) {
    std::terminate();
  }
  ppSVar2 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                      ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                       ((this->elements).data_ + index * 2));
  SVar1 = (((ParameterDeclarationBaseSyntax *)*ppSVar2)->super_SyntaxNode).kind;
  if ((SVar1 != ParameterDeclaration) && (SVar1 != TypeParameterDeclaration)) {
    assert::assertFailed
              ("T::isKind(kind)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/syntax/SyntaxNode.h"
               ,0x68,
               "T &slang::syntax::SyntaxNode::as() [T = slang::syntax::ParameterDeclarationBaseSyntax]"
              );
  }
  return (ParameterDeclarationBaseSyntax *)*ppSVar2;
}

Assistant:

T* operator[](size_t index) {
        index <<= 1;
        return &elements[index].node()->template as<T>();
    }